

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void P_FindFloorCeiling(AActor *actor,int flags)

{
  bool bVar1;
  int iVar2;
  uint flags_00;
  FPortalGroupArray grouplist;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FCheckPosition local_1b0;
  FPortalGroupArray local_118;
  CheckResult local_f0;
  FMultiBlockLinesIterator local_c8;
  
  local_1b0.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_1b0.LastRipped,1);
  local_1b0.DoRipping = false;
  local_1b0.PushTime = 0;
  local_1b0.FromPMove = false;
  local_1b0.pos.Z = (actor->__Pos).Z;
  local_1b0.pos.X = (actor->__Pos).X;
  local_1b0.pos.Y = (actor->__Pos).Y;
  flags_00 = flags * 8 & 8U | flags;
  if ((flags & 2U) != 0) {
    local_1b0.sector = actor->Sector;
  }
  local_1b0.thing = actor;
  P_GetFloorCeilingZ(&local_1b0,flags_00);
  if ((local_1b0.thing)->Sector == (sector_t *)0x0) {
    __assert_fail("tmf.thing->Sector != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0xf7,"void P_FindFloorCeiling(AActor *, int)");
  }
  actor->dropoffz = local_1b0.dropoffz;
  actor->floorz = local_1b0.floorz;
  actor->ceilingz = local_1b0.ceilingz;
  actor->floorpic = (FTextureID)local_1b0.floorpic.texnum;
  actor->floorterrain = local_1b0.floorterrain;
  actor->floorsector = local_1b0.floorsector;
  (actor->ceilingpic).texnum = local_1b0.ceilingpic.texnum;
  actor->ceilingsector = local_1b0.ceilingsector;
  if (ffcf_verbose == true) {
    Printf("Starting with ceilingz = %f, floorz = %f\n",local_1b0.ceilingz);
  }
  validcount = validcount + 1;
  local_1b0.touchmidtex = false;
  local_1b0.abovemidtex = false;
  local_118.data.Array = (unsigned_short *)0x0;
  local_118.data.Most = 0;
  local_118.data.Count = 0;
  local_118.method = 1;
  local_118.varused = '\0';
  local_118.inited = false;
  FMultiBlockLinesIterator::FMultiBlockLinesIterator(&local_c8,&local_118,actor,-1.0);
  if (actor->floorsector == actor->Sector) {
    local_c8.continuedown = false;
  }
  if (actor->ceilingsector == actor->Sector) {
    local_c8.continueup = false;
  }
  while (bVar1 = FMultiBlockLinesIterator::Next(&local_c8,&local_f0), bVar1) {
    PIT_FindFloorCeiling
              (&local_c8,&local_f0,&local_c8.bbox,&local_1b0,local_f0.portalflags | flags_00);
  }
  if (local_1b0.touchmidtex == true) {
    local_1b0.dropoffz = local_1b0.floorz;
  }
  if (((flags & 1U) == 0) ||
     ((local_1b0.abovemidtex == true && (local_1b0.floorz <= (actor->__Pos).Z)))) {
    actor->floorz = local_1b0.floorz;
    actor->dropoffz = local_1b0.dropoffz;
    actor->floorpic = (FTextureID)local_1b0.floorpic.texnum;
    actor->floorterrain = local_1b0.floorterrain;
    actor->floorsector = local_1b0.floorsector;
  }
  else {
    iVar2 = (local_1b0.floorsector)->PortalGroup;
    if (iVar2 != actor->Sector->PortalGroup) {
      actor->floorz = local_1b0.floorz;
      actor->dropoffz = local_1b0.dropoffz;
      actor->floorpic = (FTextureID)local_1b0.floorpic.texnum;
      actor->floorterrain = local_1b0.floorterrain;
      actor->floorsector = local_1b0.floorsector;
      iVar2 = actor->Sector->PortalGroup;
    }
    if ((local_1b0.ceilingsector)->PortalGroup == iVar2) goto LAB_00409a52;
  }
  actor->ceilingz = local_1b0.ceilingz;
  (actor->ceilingpic).texnum = local_1b0.ceilingpic.texnum;
  actor->ceilingsector = local_1b0.ceilingsector;
LAB_00409a52:
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_118.data);
  M_Free(local_1b0.LastRipped.Nodes);
  return;
}

Assistant:

void P_FindFloorCeiling(AActor *actor, int flags)
{
	FCheckPosition tmf;

	tmf.thing = actor;
	tmf.pos = actor->Pos();

	if (flags & FFCF_ONLYSPAWNPOS)
	{
		flags |= FFCF_3DRESTRICT;
	}
	if (flags & FFCF_SAMESECTOR)
	{
		tmf.sector = actor->Sector;
	}
	P_GetFloorCeilingZ(tmf, flags);
	assert(tmf.thing->Sector != NULL);

	actor->floorz = tmf.floorz;
	actor->dropoffz = tmf.dropoffz;
	actor->ceilingz = tmf.ceilingz;
	actor->floorpic = tmf.floorpic;
	actor->floorterrain = tmf.floorterrain;
	actor->floorsector = tmf.floorsector;
	actor->ceilingpic = tmf.ceilingpic;
	actor->ceilingsector = tmf.ceilingsector;
	if (ffcf_verbose) Printf("Starting with ceilingz = %f, floorz = %f\n", tmf.ceilingz, tmf.floorz);

	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	validcount++;

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, actor);
	FMultiBlockLinesIterator::CheckResult cres;

	// if we already have a valid floor/ceiling sector within the current sector, 
	// we do not need to iterate through plane portals to find a floor or ceiling.
	if (actor->floorsector == actor->Sector) mit.StopDown();
	if (actor->ceilingsector == actor->Sector) mit.StopUp();

	while ((mit.Next(&cres)))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, flags|cres.portalflags);
	}

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	bool usetmf = !(flags & FFCF_ONLYSPAWNPOS) || (tmf.abovemidtex && (tmf.floorz <= actor->Z()));

	// when actual floor or ceiling are beyond a portal plane we also need to use the result of the blockmap iterator, regardless of the flags being specified.
	if (usetmf || tmf.floorsector->PortalGroup != actor->Sector->PortalGroup)
	{
		actor->floorz = tmf.floorz;
		actor->dropoffz = tmf.dropoffz;
		actor->floorpic = tmf.floorpic;
		actor->floorterrain = tmf.floorterrain;
		actor->floorsector = tmf.floorsector;
	}

	if (usetmf || tmf.ceilingsector->PortalGroup != actor->Sector->PortalGroup)
	{
		actor->ceilingz = tmf.ceilingz;
		actor->ceilingpic = tmf.ceilingpic;
		actor->ceilingsector = tmf.ceilingsector;
	}
}